

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DOMRangeImpl::isValidAncestorType(DOMRangeImpl *this,DOMNode *node)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMNode *aNode;
  
  while (node != (DOMNode *)0x0) {
    uVar1 = (*node->_vptr_DOMNode[4])(node);
    if (((ushort)uVar1 < 0xd) && ((0x1440U >> (uVar1 & 0x1f) & 1) != 0)) break;
    iVar2 = (*node->_vptr_DOMNode[5])(node);
    node = (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  return node == (DOMNode *)0x0;
}

Assistant:

bool DOMRangeImpl::isValidAncestorType(const DOMNode* node) const
{
    for (DOMNode* aNode = (DOMNode*) node; aNode!=0; aNode = aNode->getParentNode()) {
        short type = aNode->getNodeType();
        if ( type == DOMNode::ENTITY_NODE
            || type == DOMNode::NOTATION_NODE
            || type == DOMNode::DOCUMENT_TYPE_NODE)
            return false;
    }
    return true;
}